

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimemagicrule.cpp
# Opt level: O1

Type QMimeMagicRule::type(QByteArray *theTypeName)

{
  char *__s1;
  size_t __n;
  int iVar1;
  int i;
  long index;
  View VVar2;
  
  index = 1;
  do {
    __s1 = (theTypeName->d).ptr;
    __n = (theTypeName->d).size;
    VVar2 = QOffsetStringArray<std::array<char,_65UL>,_std::array<unsigned_char,_10UL>_>::viewAt
                      (&magicRuleTypes,index);
    if (__n == VVar2.m_size) {
      if (__n == 0) goto LAB_004b6852;
      iVar1 = bcmp(__s1,VVar2.m_data,__n);
      if (iVar1 == 0) goto LAB_004b6852;
    }
    index = index + 1;
  } while (index != 9);
  index = 0;
LAB_004b6852:
  return (Type)index;
}

Assistant:

QMimeMagicRule::Type QMimeMagicRule::type(const QByteArray &theTypeName)
{
    for (int i = String; i <= Byte; ++i) {
        if (theTypeName == magicRuleTypes.viewAt(i))
            return Type(i);
    }
    return Invalid;
}